

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_from(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue val;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue func_obj;
  JSValue func_obj_00;
  JSValue this_obj;
  JSValue val_00;
  JSValue obj;
  JSValue val_01;
  JSValue this_obj_00;
  JSValue this_obj_01;
  JSValue this_obj_02;
  JSValue this_obj_03;
  JSValue func_obj_01;
  JSValue obj_00;
  JSValue method;
  JSValue new_target;
  JSValue enum_obj;
  JSValue val_02;
  JSValue enum_obj_00;
  JSValue this_obj_04;
  JSValue obj_01;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  JSValue val_03;
  JSValue val_04;
  JSValue v_13;
  JSValue v_14;
  JSValue JVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSValueUnion *in_R8;
  JSValue JVar5;
  int mapping;
  int done;
  int64_t len;
  int64_t k;
  JSValue arrayLike;
  JSValue v2;
  JSValue v;
  JSValue iter;
  JSValue stack [2];
  JSValue args [2];
  JSValue this_arg;
  JSValue mapfn;
  JSValue items;
  JSValue r;
  JSValue v_2;
  JSValue v_1;
  undefined4 local_3b8;
  JSAtom prop;
  JSContext *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  uint in_stack_fffffffffffffc64;
  JSValueUnion in_stack_fffffffffffffc68;
  JSContext *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  JSValueUnion in_stack_fffffffffffffc80;
  JSValueUnion in_stack_fffffffffffffc88;
  JSContext *in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  BOOL in_stack_fffffffffffffca4;
  JSValue *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  JSValue in_stack_fffffffffffffcc0;
  JSContext *in_stack_fffffffffffffcd0;
  JSValueUnion in_stack_fffffffffffffcd8;
  JSContext *in_stack_fffffffffffffce0;
  JSValueUnion JVar6;
  undefined4 in_stack_fffffffffffffce8;
  BOOL in_stack_fffffffffffffcec;
  JSContext *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  JSValueUnion local_2f8;
  JSValueUnion local_2e0;
  JSValueUnion local_2d8;
  JSValueUnion local_2d0;
  int64_t local_2c8;
  JSValueUnion local_2c0;
  int64_t local_2b8;
  JSValueUnion local_2b0;
  int64_t local_2a8;
  undefined4 uVar7;
  uint in_stack_fffffffffffffd74;
  BOOL *pdone;
  uint uStack_27c;
  uint uStack_26c;
  JSAtom prop_00;
  undefined4 uVar8;
  uint in_stack_fffffffffffffda4;
  undefined8 uVar9;
  undefined4 uVar10;
  uint in_stack_fffffffffffffdb4;
  undefined8 uVar11;
  undefined4 uVar12;
  uint in_stack_fffffffffffffdc4;
  int local_22c;
  long local_228;
  ulong local_220;
  JSValueUnion local_218;
  int64_t local_210;
  JSValueUnion local_208;
  JSValueUnion local_200;
  JSValueUnion local_1f8;
  JSValueUnion JStack_1f0;
  JSValueUnion local_1e8;
  int64_t local_1e0;
  JSValueUnion local_1d8;
  int64_t local_1d0;
  long local_1c8;
  undefined4 throw_ref_error;
  JSValueUnion local_1b8;
  JSValueUnion JStack_1b0;
  JSContext *local_1a8;
  undefined8 local_1a0;
  JSValueUnion local_198;
  JSValueUnion local_190;
  JSValueUnion local_188;
  JSValueUnion local_180;
  JSValueUnion local_178;
  JSValueUnion local_170;
  JSValueUnion *local_168;
  int local_15c;
  JSContext *local_158;
  JSValueUnion local_150;
  int64_t local_148;
  JSValueUnion local_140;
  int64_t local_138;
  undefined4 local_12c;
  JSContext *local_128;
  JSValueUnion local_120;
  JSValueUnion local_118;
  JSValueUnion local_110;
  int64_t local_108;
  undefined4 local_fc;
  JSContext *local_f8;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  undefined4 local_dc;
  JSContext *local_d8;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  JSValueUnion local_c0;
  int64_t local_b8;
  JSValueUnion local_b0;
  undefined8 local_a8;
  uint local_9c;
  JSContext *local_98;
  JSValueUnion local_90;
  int64_t local_88;
  uint local_7c;
  JSContext *local_78;
  uint local_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  JSValueUnion local_60;
  double local_58;
  JSValueUnion local_50;
  undefined8 local_48;
  long local_40;
  JSContext *local_38;
  JSValueUnion local_30;
  double local_28;
  int local_1c;
  JSContext *local_18;
  int local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  local_178 = *in_R8;
  local_170 = in_R8[1];
  bVar3 = false;
  uVar12 = 0;
  local_188.ptr = (void *)((ulong)in_stack_fffffffffffffdc4 << 0x20);
  local_180.float64 = 1.48219693752374e-323;
  uVar10 = 0;
  uVar11 = 3;
  local_198.ptr = (void *)((ulong)in_stack_fffffffffffffdb4 << 0x20);
  local_190.float64 = 1.48219693752374e-323;
  uVar8 = 0;
  uVar9 = 3;
  local_140.ptr = (void *)((ulong)in_stack_fffffffffffffda4 << 0x20);
  local_138 = 3;
  prop_00 = 0;
  local_218.ptr = (void *)((ulong)uStack_26c << 0x20);
  local_210 = 3;
  local_1d8.ptr = (void *)((ulong)uStack_27c << 0x20);
  local_1d0 = 3;
  uVar7 = 0;
  pdone = (BOOL *)0x3;
  local_1c8 = (ulong)in_stack_fffffffffffffd74 << 0x20;
  throw_ref_error = 3;
  local_158 = in_RDI;
  local_150 = in_RSI;
  local_148 = in_RDX;
  if (in_ECX < 2) {
LAB_001b3b8a:
    local_120 = local_178;
    local_118 = local_170;
    local_128 = local_158;
    local_12c = 0xc6;
    _local_3b8 = _local_3b8 & 0xffffffff00000000;
    obj_01.tag._0_4_ = uVar12;
    obj_01.u.float64 = (double)uVar11;
    obj_01.tag._4_4_ = in_stack_fffffffffffffdc4;
    this_obj_04.tag._0_4_ = uVar10;
    this_obj_04.u.float64 = (double)uVar9;
    this_obj_04.tag._4_4_ = in_stack_fffffffffffffdb4;
    _local_110 = JS_GetPropertyInternal
                           ((JSContext *)CONCAT44(in_stack_fffffffffffffda4,uVar8),obj_01,prop_00,
                            this_obj_04,throw_ref_error);
    local_1e8 = local_110;
    local_1e0 = local_108;
    iVar4 = JS_IsException(_local_110);
    if (iVar4 == 0) {
      v_10.tag = local_1e0;
      v_10.u.float64 = local_1e8.float64;
      iVar4 = JS_IsUndefined(v_10);
      if (iVar4 == 0) {
        v_00.u._4_4_ = in_stack_fffffffffffffc5c;
        v_00.u.int32 = in_stack_fffffffffffffc58;
        v_00.tag._0_4_ = in_stack_fffffffffffffc60;
        v_00.tag._4_4_ = in_stack_fffffffffffffc64;
        JS_FreeValue(in_stack_fffffffffffffc50,v_00);
        val_03.tag = local_148;
        val_03.u.float64 = local_150.float64;
        iVar4 = JS_IsConstructor(local_158,val_03);
        if (iVar4 == 0) {
          JVar5 = JS_NewArray(in_stack_fffffffffffffc50);
          local_2c0 = JVar5.u;
          local_140 = local_2c0;
          local_2b8 = JVar5.tag;
          local_138 = local_2b8;
        }
        else {
          func_obj.tag = (int64_t)in_stack_fffffffffffffc70;
          func_obj.u.ptr = in_stack_fffffffffffffc68.ptr;
          JVar5 = JS_CallConstructor((JSContext *)
                                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                                     func_obj,in_stack_fffffffffffffc5c,
                                     (JSValue *)in_stack_fffffffffffffc50);
          local_2b0 = JVar5.u;
          local_140 = local_2b0;
          local_2a8 = JVar5.tag;
          local_138 = local_2a8;
        }
        v_13.tag = local_138;
        v_13.u.float64 = local_140.float64;
        iVar4 = JS_IsException(v_13);
        if (iVar4 == 0) {
          v_12.tag = (int64_t)local_170.ptr;
          v_12.u.float64 = local_178.float64;
          JVar5 = JS_DupValue(local_158,v_12);
          local_2d0 = JVar5.u;
          local_1d8 = local_2d0;
          local_2c8 = JVar5.tag;
          local_1d0 = local_2c8;
          iVar4 = js_for_of_start((JSContext *)
                                  CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                                  in_stack_fffffffffffffca8,in_stack_fffffffffffffca4);
          if (iVar4 == 0) {
            local_220 = 0;
            while( true ) {
              in_stack_fffffffffffffc50 = (JSContext *)&local_22c;
              prop = 0;
              enum_obj.u._4_4_ = in_stack_fffffffffffffcec;
              enum_obj.u.int32 = in_stack_fffffffffffffce8;
              enum_obj.tag = (int64_t)in_stack_fffffffffffffcf0;
              method.tag = (int64_t)in_stack_fffffffffffffce0;
              method.u.float64 = in_stack_fffffffffffffcd8.float64;
              JVar5 = JS_IteratorNext(in_stack_fffffffffffffcd0,enum_obj,method,
                                      in_stack_fffffffffffffcc0.tag._4_4_,
                                      (JSValue *)CONCAT44(in_stack_fffffffffffffd74,uVar7),pdone);
              local_2e0 = JVar5.u;
              local_1f8 = local_2e0;
              local_2d8 = (JSValueUnion)JVar5.tag;
              JStack_1f0 = local_2d8;
              iVar4 = JS_IsException(JVar5);
              if (iVar4 != 0) break;
              if (local_22c != 0) goto LAB_001b45a7;
              if (bVar3) {
                local_1b8 = local_1f8;
                JStack_1b0 = JStack_1f0;
                local_d8 = local_158;
                local_dc = (undefined4)local_220;
                local_d0 = (undefined4)local_220;
                local_c8 = 0;
                local_1a8 = (JSContext *)CONCAT44(uStack_cc,(undefined4)local_220);
                local_1a0 = 0;
                func_obj_01.tag._0_4_ = in_stack_fffffffffffffca0;
                func_obj_01.u = (JSValueUnion)in_stack_fffffffffffffc98;
                func_obj_01.tag._4_4_ = in_stack_fffffffffffffca4;
                this_obj_00.tag = (int64_t)in_stack_fffffffffffffc90;
                this_obj_00.u.ptr = in_stack_fffffffffffffc88.ptr;
                JVar5 = JS_Call((JSContext *)in_stack_fffffffffffffc80.ptr,func_obj_01,this_obj_00,
                                in_stack_fffffffffffffc7c,(JSValue *)in_stack_fffffffffffffcc0.u.ptr
                               );
                in_stack_fffffffffffffd00 = JVar5.u._0_4_;
                in_stack_fffffffffffffd04 = JVar5.u._4_4_;
                local_2f8 = (JSValueUnion)JVar5.tag;
                local_208 = JVar5.u;
                local_200 = local_2f8;
                v_01.u._4_4_ = in_stack_fffffffffffffc5c;
                v_01.u.int32 = in_stack_fffffffffffffc58;
                v_01.tag._0_4_ = in_stack_fffffffffffffc60;
                v_01.tag._4_4_ = in_stack_fffffffffffffc64;
                JS_FreeValue(in_stack_fffffffffffffc50,v_01);
                local_1f8.float64 = local_208.float64;
                JStack_1f0.float64 = local_200.float64;
                v_08.tag = (int64_t)local_200.ptr;
                v_08.u.float64 = local_208.float64;
                iVar4 = JS_IsException(v_08);
                if (iVar4 != 0) break;
              }
              this_obj_01.tag = (int64_t)in_stack_fffffffffffffc90;
              this_obj_01.u.ptr = in_stack_fffffffffffffc88.ptr;
              val_00.u._4_4_ = in_stack_fffffffffffffc7c;
              val_00.u.int32 = in_stack_fffffffffffffc78;
              val_00.tag = (int64_t)in_stack_fffffffffffffc80.ptr;
              iVar4 = JS_DefinePropertyValueInt64
                                (in_stack_fffffffffffffc70,this_obj_01,
                                 (int64_t)in_stack_fffffffffffffc68,val_00,in_stack_fffffffffffffd00
                                );
              if (iVar4 < 0) break;
              local_220 = local_220 + 1;
            }
            v_11.tag = local_1d0;
            v_11.u.float64 = local_1d8.float64;
            iVar4 = JS_IsUndefined(v_11);
            if (iVar4 == 0) {
              enum_obj_00.tag._0_4_ = in_stack_fffffffffffffd00;
              enum_obj_00.u = (JSValueUnion)in_stack_fffffffffffffcf8;
              enum_obj_00.tag._4_4_ = in_stack_fffffffffffffd04;
              JS_IteratorClose(in_stack_fffffffffffffcf0,enum_obj_00,in_stack_fffffffffffffcec);
            }
          }
        }
      }
      else {
        val_02.u._4_4_ = in_stack_fffffffffffffcec;
        val_02.u.int32 = in_stack_fffffffffffffce8;
        val_02.tag = (int64_t)in_stack_fffffffffffffcf0;
        JVar5 = JS_ToObject(in_stack_fffffffffffffce0,val_02);
        local_218 = JVar5.u;
        local_210 = JVar5.tag;
        iVar4 = JS_IsException(JVar5);
        if ((iVar4 == 0) &&
           (obj.u._4_4_ = in_stack_fffffffffffffc7c, obj.u.int32 = in_stack_fffffffffffffc78,
           obj.tag = (int64_t)in_stack_fffffffffffffc80.ptr,
           iVar4 = js_get_length64(in_stack_fffffffffffffc70,
                                   (int64_t *)in_stack_fffffffffffffc68.ptr,obj), -1 < iVar4)) {
          local_38 = local_158;
          local_40 = local_228;
          iVar4 = (int)local_228;
          if (local_228 == iVar4) {
            local_18 = local_158;
            local_8 = 0;
            local_50._4_4_ = uStack_c;
            local_50.int32 = iVar4;
            local_48 = 0;
            local_28 = 0.0;
            local_30 = local_50;
            local_1c = iVar4;
            local_10 = iVar4;
          }
          else {
            _local_60 = __JS_NewFloat64(local_158,(double)local_228);
            local_30 = local_60;
            local_28 = local_58;
          }
          local_1f8.float64 = local_30.float64;
          JStack_1f0.float64 = local_28;
          local_1b8.float64 = local_30.float64;
          val_04.tag = local_148;
          val_04.u.float64 = local_150.float64;
          JVar6 = local_30;
          JStack_1b0.float64 = JStack_1f0.float64;
          iVar4 = JS_IsConstructor(local_158,val_04);
          if (iVar4 == 0) {
            new_target.tag = (int64_t)JVar6.ptr;
            new_target.u.float64 = in_stack_fffffffffffffcd8.float64;
            in_stack_fffffffffffffcc0 =
                 js_array_constructor
                           (in_stack_fffffffffffffcd0,new_target,in_stack_fffffffffffffcc0.tag._4_4_
                            ,(JSValue *)in_stack_fffffffffffffcc0.u.ptr);
            local_140 = in_stack_fffffffffffffcc0.u;
            local_138 = in_stack_fffffffffffffcc0.tag;
          }
          else {
            func_obj_00.tag = (int64_t)in_stack_fffffffffffffc70;
            func_obj_00.u.ptr = in_stack_fffffffffffffc68.ptr;
            JVar5 = JS_CallConstructor((JSContext *)
                                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                                       ,func_obj_00,in_stack_fffffffffffffc5c,
                                       (JSValue *)in_stack_fffffffffffffc50);
            local_140 = JVar5.u;
            local_138 = JVar5.tag;
          }
          v_02.u._4_4_ = in_stack_fffffffffffffc5c;
          v_02.u.int32 = in_stack_fffffffffffffc58;
          v_02.tag._0_4_ = in_stack_fffffffffffffc60;
          v_02.tag._4_4_ = in_stack_fffffffffffffc64;
          JS_FreeValue(in_stack_fffffffffffffc50,v_02);
          v_14.tag = local_138;
          v_14.u.float64 = local_140.float64;
          iVar4 = JS_IsException(v_14);
          if (iVar4 == 0) {
            for (local_220 = 0; prop = (JSAtom)(_local_3b8 >> 0x20), (long)local_220 < local_228;
                local_220 = local_220 + 1) {
              obj_00.tag._0_4_ = in_stack_fffffffffffffca0;
              obj_00.u = (JSValueUnion)in_stack_fffffffffffffc98;
              obj_00.tag._4_4_ = in_stack_fffffffffffffca4;
              JVar5 = JS_GetPropertyInt64(in_stack_fffffffffffffc90,obj_00,
                                          (int64_t)in_stack_fffffffffffffc88);
              in_stack_fffffffffffffca0 = JVar5.u._0_4_;
              in_stack_fffffffffffffca4 = JVar5.u._4_4_;
              JStack_1f0 = (JSValueUnion)JVar5.tag;
              local_1f8 = JVar5.u;
              iVar4 = JS_IsException(JVar5);
              if (iVar4 != 0) goto LAB_001b4730;
              if (bVar3) {
                local_1b8 = local_1f8;
                JStack_1b0 = JStack_1f0;
                local_f8 = local_158;
                local_fc = (undefined4)local_220;
                local_f0 = (undefined4)local_220;
                local_e8 = 0;
                in_stack_fffffffffffffc90 = (JSContext *)CONCAT44(uStack_ec,(undefined4)local_220);
                in_stack_fffffffffffffc98 = 0;
                local_1a0 = 0;
                prop = (JSAtom)((ulong)&local_1b8 >> 0x20);
                auVar2._4_4_ = in_stack_fffffffffffffca4;
                auVar2._0_4_ = in_stack_fffffffffffffca0;
                auVar2._8_8_ = 0;
                this_obj_02.tag = (int64_t)in_stack_fffffffffffffc90;
                this_obj_02.u.ptr = in_stack_fffffffffffffc88.ptr;
                local_1a8 = in_stack_fffffffffffffc90;
                JVar5 = JS_Call((JSContext *)in_stack_fffffffffffffc80.ptr,(JSValue)(auVar2 << 0x40)
                                ,this_obj_02,in_stack_fffffffffffffc7c,
                                (JSValue *)in_stack_fffffffffffffcc0.u.ptr);
                in_stack_fffffffffffffc80 = JVar5.u;
                in_stack_fffffffffffffc88 = (JSValueUnion)JVar5.tag;
                v_03.u._4_4_ = in_stack_fffffffffffffc5c;
                v_03.u.int32 = in_stack_fffffffffffffc58;
                v_03.tag._0_4_ = in_stack_fffffffffffffc60;
                v_03.tag._4_4_ = in_stack_fffffffffffffc64;
                local_208 = in_stack_fffffffffffffc80;
                local_200 = in_stack_fffffffffffffc88;
                JS_FreeValue(in_stack_fffffffffffffc50,v_03);
                local_1f8.float64 = local_208.float64;
                JStack_1f0.float64 = local_200.float64;
                v_09.tag = (int64_t)local_200.ptr;
                v_09.u.ptr = local_208.ptr;
                iVar4 = JS_IsException(v_09);
                if (iVar4 != 0) goto LAB_001b4730;
              }
              _local_3b8 = CONCAT44(prop,0x4007);
              this_obj_03.tag = (int64_t)in_stack_fffffffffffffc90;
              this_obj_03.u.ptr = in_stack_fffffffffffffc88.ptr;
              val_01.u._4_4_ = in_stack_fffffffffffffc7c;
              val_01.u.int32 = in_stack_fffffffffffffc78;
              val_01.tag = (int64_t)in_stack_fffffffffffffc80.ptr;
              iVar4 = JS_DefinePropertyValueInt64
                                (in_stack_fffffffffffffc70,this_obj_03,
                                 (int64_t)in_stack_fffffffffffffc68,val_01,in_stack_fffffffffffffd00
                                );
              if (iVar4 < 0) goto LAB_001b4730;
            }
LAB_001b45a7:
            in_stack_fffffffffffffc58 = SUB84(local_158,0);
            in_stack_fffffffffffffc5c = (int)((ulong)local_158 >> 0x20);
            local_98 = local_158;
            local_9c = (uint)local_220;
            if (local_9c < 0x80000000) {
              local_78 = local_158;
              local_68 = 0;
              local_b0._4_4_ = uStack_6c;
              local_b0.int32 = local_9c;
              local_a8 = 0;
              local_88 = 0;
              local_90 = local_b0;
              local_7c = local_9c;
              local_70 = local_9c;
            }
            else {
              _local_c0 = __JS_NewFloat64(local_158,(double)(local_220 & 0xffffffff));
              local_90 = local_c0;
              local_88 = local_b8;
            }
            this_obj.tag = (int64_t)local_90.ptr;
            this_obj.u.float64 = in_stack_fffffffffffffc68.float64;
            val.u._4_4_ = in_stack_fffffffffffffc5c;
            val.u.int32 = in_stack_fffffffffffffc58;
            val.tag._0_4_ = in_stack_fffffffffffffc60;
            val.tag._4_4_ = in_stack_fffffffffffffc64;
            iVar4 = JS_SetProperty(in_stack_fffffffffffffc50,this_obj,prop,val);
            if (-1 < iVar4) goto LAB_001b4778;
          }
        }
      }
    }
  }
  else {
    local_188 = in_R8[2];
    local_180 = in_R8[3];
    local_168 = in_R8;
    local_15c = in_ECX;
    prop_00 = 0;
    throw_ref_error = 3;
    iVar4 = JS_IsUndefined(*(JSValue *)(in_R8 + 2));
    if (iVar4 != 0) goto LAB_001b3b8a;
    JVar5.u._4_4_ = in_stack_fffffffffffffc64;
    JVar5.u.int32 = in_stack_fffffffffffffc60;
    JVar5.tag = (int64_t)in_stack_fffffffffffffc68.ptr;
    iVar4 = check_function((JSContext *)
                           CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),JVar5);
    if (iVar4 == 0) {
      bVar3 = true;
      if (2 < local_15c) {
        local_198 = local_168[4];
        local_190 = local_168[5];
      }
      goto LAB_001b3b8a;
    }
  }
LAB_001b4730:
  v_04.u._4_4_ = in_stack_fffffffffffffc5c;
  v_04.u.int32 = in_stack_fffffffffffffc58;
  v_04.tag._0_4_ = in_stack_fffffffffffffc60;
  v_04.tag._4_4_ = in_stack_fffffffffffffc64;
  JS_FreeValue(in_stack_fffffffffffffc50,v_04);
  in_stack_fffffffffffffc60 = 0;
  local_140.ptr = (void *)((ulong)in_stack_fffffffffffffc64 << 0x20);
  local_138 = 6;
LAB_001b4778:
  v_05.u._4_4_ = in_stack_fffffffffffffc5c;
  v_05.u.int32 = in_stack_fffffffffffffc58;
  v_05.tag._0_4_ = in_stack_fffffffffffffc60;
  v_05.tag._4_4_ = in_stack_fffffffffffffc64;
  JS_FreeValue(in_stack_fffffffffffffc50,v_05);
  v_06.u._4_4_ = in_stack_fffffffffffffc5c;
  v_06.u.int32 = in_stack_fffffffffffffc58;
  v_06.tag._0_4_ = in_stack_fffffffffffffc60;
  v_06.tag._4_4_ = in_stack_fffffffffffffc64;
  JS_FreeValue(in_stack_fffffffffffffc50,v_06);
  v_07.u._4_4_ = in_stack_fffffffffffffc5c;
  v_07.u.int32 = in_stack_fffffffffffffc58;
  v_07.tag._0_4_ = in_stack_fffffffffffffc60;
  v_07.tag._4_4_ = in_stack_fffffffffffffc64;
  JS_FreeValue(in_stack_fffffffffffffc50,v_07);
  JVar1.tag = local_138;
  JVar1.u.ptr = local_140.ptr;
  return JVar1;
}

Assistant:

static JSValue js_array_from(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    // from(items, mapfn = void 0, this_arg = void 0)
    JSValueConst items = argv[0], mapfn, this_arg;
    JSValueConst args[2];
    JSValue stack[2];
    JSValue iter, r, v, v2, arrayLike;
    int64_t k, len;
    int done, mapping;

    mapping = FALSE;
    mapfn = JS_UNDEFINED;
    this_arg = JS_UNDEFINED;
    r = JS_UNDEFINED;
    arrayLike = JS_UNDEFINED;
    stack[0] = JS_UNDEFINED;
    stack[1] = JS_UNDEFINED;

    if (argc > 1) {
        mapfn = argv[1];
        if (!JS_IsUndefined(mapfn)) {
            if (check_function(ctx, mapfn))
                goto exception;
            mapping = 1;
            if (argc > 2)
                this_arg = argv[2];
        }
    }
    iter = JS_GetProperty(ctx, items, JS_ATOM_Symbol_iterator);
    if (JS_IsException(iter))
        goto exception;
    if (!JS_IsUndefined(iter)) {
        JS_FreeValue(ctx, iter);
        if (JS_IsConstructor(ctx, this_val))
            r = JS_CallConstructor(ctx, this_val, 0, NULL);
        else
            r = JS_NewArray(ctx);
        if (JS_IsException(r))
            goto exception;
        stack[0] = JS_DupValue(ctx, items);
        if (js_for_of_start(ctx, &stack[1], FALSE))
            goto exception;
        for (k = 0;; k++) {
            v = JS_IteratorNext(ctx, stack[0], stack[1], 0, NULL, &done);
            if (JS_IsException(v))
                goto exception_close;
            if (done)
                break;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception_close;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception_close;
        }
    } else {
        arrayLike = JS_ToObject(ctx, items);
        if (JS_IsException(arrayLike))
            goto exception;
        if (js_get_length64(ctx, &len, arrayLike) < 0)
            goto exception;
        v = JS_NewInt64(ctx, len);
        args[0] = v;
        if (JS_IsConstructor(ctx, this_val)) {
            r = JS_CallConstructor(ctx, this_val, 1, args);
        } else {
            r = js_array_constructor(ctx, JS_UNDEFINED, 1, args);
        }
        JS_FreeValue(ctx, v);
        if (JS_IsException(r))
            goto exception;
        for(k = 0; k < len; k++) {
            v = JS_GetPropertyInt64(ctx, arrayLike, k);
            if (JS_IsException(v))
                goto exception;
            if (mapping) {
                args[0] = v;
                args[1] = JS_NewInt32(ctx, k);
                v2 = JS_Call(ctx, mapfn, this_arg, 2, args);
                JS_FreeValue(ctx, v);
                v = v2;
                if (JS_IsException(v))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, r, k, v,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
    }
    if (JS_SetProperty(ctx, r, JS_ATOM_length, JS_NewUint32(ctx, k)) < 0)
        goto exception;
    goto done;

 exception_close:
    if (!JS_IsUndefined(stack[0]))
        JS_IteratorClose(ctx, stack[0], TRUE);
 exception:
    JS_FreeValue(ctx, r);
    r = JS_EXCEPTION;
 done:
    JS_FreeValue(ctx, arrayLike);
    JS_FreeValue(ctx, stack[0]);
    JS_FreeValue(ctx, stack[1]);
    return r;
}